

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O0

unique_ptr<double,_std::default_delete<double>_> __thiscall
strq::Generator<std::unique_ptr<double,std::default_delete<double>>,void>::operator()
          (Generator<std::unique_ptr<double,std::default_delete<double>>,void> *this,
          Compound<strq::Arithmetic<std::normal_distribution<double>_>_> *schema)

{
  pointer __p;
  tuple<strq::Arithmetic<std::normal_distribution<double>_>_> *__t;
  __tuple_element_t<0UL,_tuple<Arithmetic<normal_distribution<double>_>_>_> *schema_00;
  Compound<strq::Arithmetic<std::normal_distribution<double>_>_> *in_RDX;
  double dVar1;
  Compound<strq::Arithmetic<std::normal_distribution<double>_>_> *schema_local;
  Generator<std::unique_ptr<double,_std::default_delete<double>_>,_void> *this_local;
  
  __p = (pointer)operator_new(8);
  __t = Compound<strq::Arithmetic<std::normal_distribution<double>_>_>::values(in_RDX);
  schema_00 = std::get<0ul,strq::Arithmetic<std::normal_distribution<double>>>(__t);
  dVar1 = random<double,strq::Arithmetic<std::normal_distribution<double>>const&>(schema_00);
  *__p = dVar1;
  std::unique_ptr<double,std::default_delete<double>>::unique_ptr<std::default_delete<double>,void>
            ((unique_ptr<double,std::default_delete<double>> *)this,__p);
  return (__uniq_ptr_data<double,_std::default_delete<double>,_true,_true>)
         (__uniq_ptr_data<double,_std::default_delete<double>,_true,_true>)this;
}

Assistant:

auto operator() (Schema&& schema) -> T
        {
            return T {new typename T::element_type {
                    random<typename T::element_type>(std::get<0>(schema.values()))
            }};
        }